

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::getDifferentiationWeights
          (TasmanianSparseGrid *this,double *x,double *weights)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  pointer pBVar4;
  double *pdVar5;
  reference pvVar6;
  int local_80;
  int local_7c;
  int j;
  int i;
  vector<double,_std::allocator<double>_> jacobian_g_diag;
  int num_points;
  int num_dimensions;
  undefined1 local_48 [8];
  Data2D<double> x_tmp;
  double *weights_local;
  double *x_local;
  TasmanianSparseGrid *this_local;
  
  x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = weights;
  Data2D<double>::Data2D((Data2D<double> *)local_48);
  pBVar4 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  pdVar5 = formCanonicalPoints<double>(this,x,(Data2D<double> *)local_48,1);
  (*pBVar4->_vptr_BaseCanonicalGrid[0xe])
            (pBVar4,pdVar5,
             x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar2 = ::std::vector<double,_std::allocator<double>_>::empty(&this->domain_transform_a);
  if (!bVar2) {
    iVar3 = getNumDimensions(this);
    jacobian_g_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = getNumPoints(this);
    diffCanonicalTransform<double>((vector<double,_std::allocator<double>_> *)&j,this);
    for (local_7c = 0;
        local_7c <
        jacobian_g_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_7c = local_7c + 1) {
      for (local_80 = 0; local_80 < iVar3; local_80 = local_80 + 1) {
        dVar1 = x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[local_7c * iVar3 + local_80];
        pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&j,(long)local_80);
        x_tmp.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[local_7c * iVar3 + local_80] = dVar1 * *pvVar6;
      }
    }
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&j);
  }
  Data2D<double>::~Data2D((Data2D<double> *)local_48);
  return;
}

Assistant:

void TasmanianSparseGrid::getDifferentiationWeights(const double x[], double weights[]) const{
    // See differentiate() for how the domain transforms are taken into consideration.
    Data2D<double> x_tmp;
    // Jacobian of f(.) at g(x).
    base->getDifferentiationWeights(formCanonicalPoints(x, x_tmp, 1), weights);
    // Jacobian of f(g(.)) at x.
    if (not domain_transform_a.empty()) {
        int num_dimensions = getNumDimensions();
        int num_points = getNumPoints();
        std::vector<double> jacobian_g_diag = diffCanonicalTransform<double>();
        for(int i=0; i<num_points; i++)
            for(int j=0; j<num_dimensions; j++)
                weights[i * num_dimensions + j] = weights[i * num_dimensions + j] * jacobian_g_diag[j];
    }
}